

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLABecLaplacian::normalize(MLABecLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  long lVar1;
  FabArray<amrex::FArrayBox> *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  Real dhz;
  long local_2b0;
  Real dhy;
  Real dhx;
  Box local_1ec;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  lVar18 = (long)mglev;
  lVar7 = *(long *)&(this->m_a_coeffs).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  lVar8 = *(long *)&(this->m_b_coeffs).
                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  this_00 = (FabArray<amrex::FArrayBox> *)(lVar8 + lVar18 * 0x480);
  lVar15 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar19 = lVar18 * 200;
  dVar2 = *(double *)(lVar15 + 0x38 + lVar19);
  dVar3 = *(double *)(lVar15 + 0x40 + lVar19);
  dVar4 = *(double *)(lVar15 + 0x48 + lVar19);
  dVar5 = this->m_a_scalar;
  dVar6 = this->m_b_scalar;
  uVar12 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,true);
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_1ec,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,(FabArray<amrex::FArrayBox> *)(lVar18 * 0x180 + lVar7),&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_150,this_00,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_190,this_00 + 1,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_1d0,(FabArray<amrex::FArrayBox> *)(lVar8 + 0x300 + lVar18 * 0x480),&mfi);
    lVar15 = (long)local_1ec.smallend.vect[0] * 8;
    local_2b0 = 0;
    for (uVar14 = 0; lVar19 = (long)local_1ec.smallend.vect[2], iVar21 = local_1ec.smallend.vect[2],
        uVar14 != uVar12; uVar14 = uVar14 + 1) {
      while (iVar21 = iVar21 + 1, (int)lVar19 <= local_1ec.bigend.vect[2]) {
        lVar24 = lVar19 - local_150.begin.z;
        lVar10 = local_190.nstride * local_2b0 +
                 (lVar19 - local_190.begin.z) * local_190.kstride * 8 + (long)local_190.begin.x * -8
                 + lVar15;
        lVar20 = lVar19 - local_1d0.begin.z;
        lVar16 = lVar19 - local_110.begin.z;
        lVar1 = lVar19 + 1;
        lVar26 = lVar19 - local_d0.begin.z;
        lVar13 = (long)local_1ec.smallend.vect[1];
        while (lVar19 = lVar1, lVar13 <= local_1ec.bigend.vect[1]) {
          if (local_1ec.bigend.vect[0] < local_1ec.smallend.vect[0]) {
            lVar13 = lVar13 + 1;
          }
          else {
            lVar22 = lVar13 - local_d0.begin.y;
            lVar9 = (lVar13 - local_150.begin.y) * local_150.jstride * 8 +
                    local_150.nstride * local_2b0 + lVar24 * local_150.kstride * 8 +
                    (long)local_150.begin.x * -8 + lVar15;
            lVar25 = lVar13 - local_190.begin.y;
            lVar19 = lVar13 + 1;
            lVar17 = (lVar13 - local_1d0.begin.y) * local_1d0.jstride * 8;
            lVar11 = (lVar13 - local_110.begin.y) * local_110.jstride * 8 +
                     local_110.nstride * local_2b0 + lVar16 * local_110.kstride * 8 +
                     (long)local_110.begin.x * -8 + lVar15;
            lVar23 = 0;
            do {
              *(double *)((long)local_110.p + lVar23 * 8 + lVar11) =
                   *(double *)((long)local_110.p + lVar23 * 8 + lVar11) /
                   ((*(double *)
                      ((long)local_1d0.p +
                      lVar23 * 8 +
                      lVar17 + lVar20 * local_1d0.kstride * 8 + local_1d0.nstride * local_2b0 +
                               (long)local_1d0.begin.x * -8 + lVar15) +
                    *(double *)
                     ((long)local_1d0.p +
                     lVar23 * 8 +
                     lVar17 + (long)(iVar21 - local_1d0.begin.z) * local_1d0.kstride * 8 +
                              local_1d0.nstride * local_2b0 + (long)local_1d0.begin.x * -8 + lVar15)
                    ) * dVar6 * dVar4 * dVar4 +
                   (*(double *)
                     ((long)local_190.p + lVar23 * 8 + lVar25 * local_190.jstride * 8 + lVar10) +
                   *(double *)
                    ((long)local_190.p +
                    lVar23 * 8 +
                    (long)((int)lVar19 - local_190.begin.y) * local_190.jstride * 8 + lVar10)) *
                   dVar3 * dVar6 * dVar3 +
                   *(double *)
                    ((long)local_d0.p +
                    lVar23 * 8 +
                    lVar22 * local_d0.jstride * 8 +
                    lVar26 * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 + lVar15) * dVar5 +
                   (*(double *)((long)local_150.p + lVar23 * 8 + lVar9) +
                   *(double *)((long)local_150.p + lVar23 * 8 + lVar9 + 8)) * dVar2 * dVar6 * dVar2)
              ;
              lVar23 = lVar23 + 1;
              lVar13 = lVar19;
            } while ((local_1ec.bigend.vect[0] - local_1ec.smallend.vect[0]) + 1 != (int)lVar23);
          }
        }
      }
      local_2b0 = local_2b0 + 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLABecLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLABecLaplacian::normalize()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& ama = acoef.const_arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        ParallelFor(mf, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            mlabeclap_normalize(i,j,k,n, ma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& fab = mf.array(mfi);
            const auto& afab = acoef.array(mfi);
            AMREX_D_TERM(const auto& bxfab = bxcoef.array(mfi);,
                         const auto& byfab = bycoef.array(mfi);,
                         const auto& bzfab = bzcoef.array(mfi););

            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                    dxinv, ascalar, bscalar);
            });
        }
    }
}